

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNode<int,_int>::MultiNode(MultiNode<int,_int> *this,MultiNode<int,_int> *other)

{
  undefined4 *puVar1;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  Chain *chain;
  Chain **e;
  Chain *c;
  undefined8 *local_20;
  undefined4 *local_18;
  
  *in_RDI = *in_RSI;
  local_20 = (undefined8 *)(in_RDI + 2);
  for (local_18 = *(undefined4 **)(in_RSI + 2); local_18 != (undefined4 *)0x0;
      local_18 = *(undefined4 **)(local_18 + 2)) {
    puVar1 = (undefined4 *)operator_new(0x10);
    *puVar1 = *local_18;
    *(undefined8 *)(puVar1 + 2) = 0;
    *local_20 = puVar1;
    local_20 = (undefined8 *)(puVar1 + 2);
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }